

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reldtfmt.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::RelativeDateFormat::format
          (RelativeDateFormat *this,Calendar *cal,UnicodeString *appendTo,FieldPosition *pos)

{
  UBool UVar1;
  int32_t iVar2;
  UChar32 c;
  undefined1 local_1a8 [8];
  UnicodeString combinedPattern;
  UnicodeString local_160;
  ConstChar16Ptr local_120;
  UnicodeString local_118;
  undefined1 local_d8 [8];
  UnicodeString datePattern;
  UChar *theString;
  int32_t local_88;
  int32_t len;
  int dayDiff;
  uint local_74;
  undefined1 local_70 [4];
  UDisplayContext capitalizationContext;
  UnicodeString relativeDayString;
  UErrorCode status;
  FieldPosition *pos_local;
  UnicodeString *appendTo_local;
  Calendar *cal_local;
  RelativeDateFormat *this_local;
  
  relativeDayString.fUnion._52_4_ = 0;
  icu_63::UnicodeString::UnicodeString((UnicodeString *)local_70);
  local_74 = (*(this->super_DateFormat).super_Format.super_UObject._vptr_UObject[0x1a])
                       (this,1,(undefined1 *)((long)&relativeDayString.fUnion + 0x34));
  local_88 = dayDifference(cal,(UErrorCode *)(relativeDayString.fUnion.fStackFields.fBuffer + 0x19))
  ;
  theString._4_4_ = 0;
  datePattern.fUnion._48_8_ =
       getStringForDay(this,local_88,(int32_t *)((long)&theString + 4),
                       (UErrorCode *)(relativeDayString.fUnion.fStackFields.fBuffer + 0x19));
  UVar1 = ::U_SUCCESS(relativeDayString.fUnion._52_4_);
  if ((UVar1 != '\0') && (datePattern.fUnion._48_8_ != 0)) {
    icu_63::UnicodeString::setTo
              ((UnicodeString *)local_70,(char16_t *)datePattern.fUnion._48_8_,theString._4_4_);
  }
  iVar2 = icu_63::UnicodeString::length((UnicodeString *)local_70);
  if (((iVar2 < 1) || (UVar1 = icu_63::UnicodeString::isEmpty(&this->fDatePattern), UVar1 != '\0'))
     || ((UVar1 = icu_63::UnicodeString::isEmpty(&this->fTimePattern), UVar1 == '\0' &&
         ((this->fCombinedFormat != (SimpleFormatter *)0x0 &&
          (this->fCombinedHasDateAtStart == '\0')))))) {
    (*(this->fDateTimeFormatter->super_DateFormat).super_Format.super_UObject._vptr_UObject[0x19])
              (this->fDateTimeFormatter,(ulong)local_74,
               (undefined1 *)((long)&relativeDayString.fUnion + 0x34));
  }
  else {
    c = icu_63::UnicodeString::char32At((UnicodeString *)local_70,0);
    UVar1 = u_islower_63(c);
    if (((UVar1 != '\0') && (this->fCapitalizationBrkIter != (BreakIterator *)0x0)) &&
       (((local_74 == 0x102 ||
         ((local_74 == 0x103 && (this->fCapitalizationOfRelativeUnitsForUIListMenu != '\0')))) ||
        ((local_74 == 0x104 && (this->fCapitalizationOfRelativeUnitsForStandAlone != '\0')))))) {
      icu_63::UnicodeString::toTitle
                ((UnicodeString *)local_70,this->fCapitalizationBrkIter,&this->fLocale,0x300);
    }
    (*(this->fDateTimeFormatter->super_DateFormat).super_Format.super_UObject._vptr_UObject[0x19])
              (this->fDateTimeFormatter,0x100,(undefined1 *)((long)&relativeDayString.fUnion + 0x34)
              );
  }
  UVar1 = icu_63::UnicodeString::isEmpty(&this->fDatePattern);
  if (UVar1 == '\0') {
    UVar1 = icu_63::UnicodeString::isEmpty(&this->fTimePattern);
    if ((UVar1 == '\0') && (this->fCombinedFormat != (SimpleFormatter *)0x0)) {
      icu_63::UnicodeString::UnicodeString((UnicodeString *)local_d8);
      iVar2 = icu_63::UnicodeString::length((UnicodeString *)local_70);
      if (iVar2 < 1) {
        icu_63::UnicodeString::setTo((UnicodeString *)local_d8,&this->fDatePattern);
      }
      else {
        ConstChar16Ptr::ConstChar16Ptr(&local_120,L"\'");
        icu_63::UnicodeString::UnicodeString(&local_118,'\x01',&local_120,1);
        ConstChar16Ptr::ConstChar16Ptr
                  ((ConstChar16Ptr *)((long)&combinedPattern.fUnion + 0x30),L"\'\'");
        icu_63::UnicodeString::UnicodeString
                  (&local_160,'\x01',(ConstChar16Ptr *)((long)&combinedPattern.fUnion + 0x30),2);
        icu_63::UnicodeString::findAndReplace((UnicodeString *)local_70,&local_118,&local_160);
        icu_63::UnicodeString::~UnicodeString(&local_160);
        ConstChar16Ptr::~ConstChar16Ptr((ConstChar16Ptr *)((long)&combinedPattern.fUnion + 0x30));
        icu_63::UnicodeString::~UnicodeString(&local_118);
        ConstChar16Ptr::~ConstChar16Ptr(&local_120);
        icu_63::UnicodeString::insert((UnicodeString *)local_70,0,L'\'');
        icu_63::UnicodeString::append((UnicodeString *)local_70,L'\'');
        icu_63::UnicodeString::setTo((UnicodeString *)local_d8,(UnicodeString *)local_70);
      }
      icu_63::UnicodeString::UnicodeString((UnicodeString *)local_1a8);
      SimpleFormatter::format
                (this->fCombinedFormat,&this->fTimePattern,(UnicodeString *)local_d8,
                 (UnicodeString *)local_1a8,
                 (UErrorCode *)(relativeDayString.fUnion.fStackFields.fBuffer + 0x19));
      (*(this->fDateTimeFormatter->super_DateFormat).super_Format.super_UObject._vptr_UObject[0x20])
                (this->fDateTimeFormatter,local_1a8);
      (*(this->fDateTimeFormatter->super_DateFormat).super_Format.super_UObject._vptr_UObject[8])
                (this->fDateTimeFormatter,cal,appendTo,pos);
      icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_1a8);
      icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_d8);
    }
    else {
      iVar2 = icu_63::UnicodeString::length((UnicodeString *)local_70);
      if (iVar2 < 1) {
        (*(this->fDateTimeFormatter->super_DateFormat).super_Format.super_UObject._vptr_UObject
          [0x20])(this->fDateTimeFormatter,&this->fDatePattern);
        (*(this->fDateTimeFormatter->super_DateFormat).super_Format.super_UObject._vptr_UObject[8])
                  (this->fDateTimeFormatter,cal,appendTo,pos);
      }
      else {
        icu_63::UnicodeString::append(appendTo,(UnicodeString *)local_70);
      }
    }
  }
  else {
    (*(this->fDateTimeFormatter->super_DateFormat).super_Format.super_UObject._vptr_UObject[0x20])
              (this->fDateTimeFormatter,&this->fTimePattern);
    (*(this->fDateTimeFormatter->super_DateFormat).super_Format.super_UObject._vptr_UObject[8])
              (this->fDateTimeFormatter,cal,appendTo,pos);
  }
  icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_70);
  return appendTo;
}

Assistant:

UnicodeString& RelativeDateFormat::format(  Calendar& cal,
                                UnicodeString& appendTo,
                                FieldPosition& pos) const {
                                
    UErrorCode status = U_ZERO_ERROR;
    UnicodeString relativeDayString;
    UDisplayContext capitalizationContext = getContext(UDISPCTX_TYPE_CAPITALIZATION, status);
    
    // calculate the difference, in days, between 'cal' and now.
    int dayDiff = dayDifference(cal, status);

    // look up string
    int32_t len = 0;
    const UChar *theString = getStringForDay(dayDiff, len, status);
    if(U_SUCCESS(status) && (theString!=NULL)) {
        // found a relative string
        relativeDayString.setTo(theString, len);
    }

    if ( relativeDayString.length() > 0 && !fDatePattern.isEmpty() && 
         (fTimePattern.isEmpty() || fCombinedFormat == NULL || fCombinedHasDateAtStart)) {
#if !UCONFIG_NO_BREAK_ITERATION
        // capitalize relativeDayString according to context for relative, set formatter no context
        if ( u_islower(relativeDayString.char32At(0)) && fCapitalizationBrkIter!= NULL &&
             ( capitalizationContext==UDISPCTX_CAPITALIZATION_FOR_BEGINNING_OF_SENTENCE ||
               (capitalizationContext==UDISPCTX_CAPITALIZATION_FOR_UI_LIST_OR_MENU && fCapitalizationOfRelativeUnitsForUIListMenu) ||
               (capitalizationContext==UDISPCTX_CAPITALIZATION_FOR_STANDALONE && fCapitalizationOfRelativeUnitsForStandAlone) ) ) {
            // titlecase first word of relativeDayString
            relativeDayString.toTitle(fCapitalizationBrkIter, fLocale, U_TITLECASE_NO_LOWERCASE | U_TITLECASE_NO_BREAK_ADJUSTMENT);
        }
#endif
        fDateTimeFormatter->setContext(UDISPCTX_CAPITALIZATION_NONE, status);
    } else {
        // set our context for the formatter
        fDateTimeFormatter->setContext(capitalizationContext, status);
    }

    if (fDatePattern.isEmpty()) {
        fDateTimeFormatter->applyPattern(fTimePattern);
        fDateTimeFormatter->format(cal,appendTo,pos);
    } else if (fTimePattern.isEmpty() || fCombinedFormat == NULL) {
        if (relativeDayString.length() > 0) {
            appendTo.append(relativeDayString);
        } else {
            fDateTimeFormatter->applyPattern(fDatePattern);
            fDateTimeFormatter->format(cal,appendTo,pos);
        }
    } else {
        UnicodeString datePattern;
        if (relativeDayString.length() > 0) {
            // Need to quote the relativeDayString to make it a legal date pattern
            relativeDayString.findAndReplace(UNICODE_STRING("'", 1), UNICODE_STRING("''", 2)); // double any existing APOSTROPHE
            relativeDayString.insert(0, APOSTROPHE); // add APOSTROPHE at beginning...
            relativeDayString.append(APOSTROPHE); // and at end
            datePattern.setTo(relativeDayString);
        } else {
            datePattern.setTo(fDatePattern);
        }
        UnicodeString combinedPattern;
        fCombinedFormat->format(fTimePattern, datePattern, combinedPattern, status);
        fDateTimeFormatter->applyPattern(combinedPattern);
        fDateTimeFormatter->format(cal,appendTo,pos);
    }

    return appendTo;
}